

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  SessionHandle *data;
  char *pcVar8;
  short *unaff_R12;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_160;
  short local_15c [2];
  Curl_dns_entry *local_158;
  int local_14c;
  SessionHandle *local_148;
  connectdata *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c [63];
  
  CVar4 = (CURLcode)unaff_R12;
  data = conn->data;
  local_158 = (Curl_dns_entry *)0x0;
  pcVar5 = (data->state).buffer + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar3 = (conn->proto).ftpc.count1;
  local_14c = ftpcode;
  if (ftpcode == 0xe5 && iVar3 == 0) {
    pcVar5 = strchr(pcVar5,0x28);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = pcVar5 + 1;
      iVar3 = __isoc99_sscanf(pcVar5,"%c%c%c%u%c",&local_160,(long)&local_160 + 1,
                              (long)&local_160 + 2,&local_138,(long)&local_160 + 3);
      bVar2 = true;
      if (iVar3 == 5) {
        lVar6 = 1;
        do {
          if (*(char *)((long)local_15c + lVar6 + -4) != (char)local_160) {
            pcVar5 = (char *)0x0;
            break;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        if (local_138 < 0x10000) {
          if (pcVar5 != (char *)0x0) {
            (conn->proto).ftpc.newport = (unsigned_short)local_138;
            if (((conn->bits).tunnel_proxy == false) &&
               ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
              pcVar8 = conn->ip_addr_str;
            }
            else {
              pcVar8 = (conn->host).name;
            }
            pcVar8 = (*Curl_cstrdup)(pcVar8);
            (conn->proto).ftpc.newhost = pcVar8;
            if (pcVar8 == (char *)0x0) {
              CVar4 = CURLE_OUT_OF_MEMORY;
              bVar2 = false;
            }
          }
        }
        else {
          bVar2 = false;
          Curl_failf(data,"Illegal port number in EPSV reply");
          CVar4 = CURLE_FTP_WEIRD_PASV_REPLY;
        }
      }
      else {
        pcVar5 = (char *)0x0;
      }
      if (!bVar2) {
LAB_004ad1ec:
        bVar2 = false;
        goto LAB_004ad1ee;
      }
    }
    bVar2 = true;
    if (pcVar5 == (char *)0x0) {
      bVar2 = false;
      Curl_failf(data,"Weirdly formatted EPSV reply");
      CVar4 = CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (ftpcode != 0xe3 || iVar3 != 1) {
      if (iVar3 != 0) {
        Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      CVar4 = ftp_epsv_disable(conn);
      return CVar4;
    }
    local_148 = data;
    local_140 = conn;
    if (*pcVar5 != '\0') {
      unaff_R12 = local_15c;
      pcVar8 = pcVar5;
      do {
        iVar3 = __isoc99_sscanf(pcVar8,"%d,%d,%d,%d,%d,%d",&local_138,&local_134,&local_130,
                                local_12c,&local_160,unaff_R12);
        pcVar5 = pcVar8;
        if (iVar3 == 6) break;
        pcVar5 = pcVar8 + 1;
        pcVar1 = pcVar8 + 1;
        pcVar8 = pcVar5;
      } while (*pcVar1 != '\0');
    }
    conn = local_140;
    data = local_148;
    CVar4 = (CURLcode)unaff_R12;
    if (*pcVar5 == '\0') {
      bVar2 = false;
      Curl_failf(local_148,"Couldn\'t interpret the 227-response");
      CVar4 = CURLE_FTP_WEIRD_227_FORMAT;
      conn = local_140;
    }
    else {
      if ((local_148->set).ftp_skip_ip == true) {
        Curl_infof(local_148,"Skip %d.%d.%d.%d for data connection, re-use %s instead\n");
        if (((conn->bits).tunnel_proxy == false) &&
           ((conn->proxytype & 0xfffffffc) != CURLPROXY_SOCKS4)) {
          pcVar5 = conn->ip_addr_str;
        }
        else {
          pcVar5 = (conn->host).name;
        }
        pcVar5 = (*Curl_cstrdup)(pcVar5);
      }
      else {
        pcVar5 = curl_maprintf("%d.%d.%d.%d",(ulong)local_138,(ulong)local_134,(ulong)local_130,
                               (ulong)local_12c[0]);
      }
      (conn->proto).ftpc.newhost = pcVar5;
      if (pcVar5 == (char *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
        goto LAB_004ad1ec;
      }
      (conn->proto).ftpc.newport = (short)(local_160 << 8) + local_15c[0];
      bVar2 = true;
    }
  }
LAB_004ad1ee:
  if (!bVar2) {
    return CVar4;
  }
  if ((conn->bits).proxy == true) {
    Curl_resolv(conn,(conn->proxy).name,(int)conn->port,&local_158);
    uVar7 = conn->port;
    if (local_158 != (Curl_dns_entry *)0x0) {
LAB_004ad273:
      (conn->bits).tcpconnect[1] = false;
      CVar4 = Curl_connecthost(conn,local_158);
      if (CVar4 == CURLE_OK) {
        if ((data->set).verbose == true) {
          pcVar5 = (conn->proto).ftpc.newhost;
          Curl_printable_address(local_158->addr,(char *)&local_138,0x100);
          Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar5,&local_138,uVar7 & 0xffff);
        }
        Curl_resolv_unlock(data,local_158);
        (conn->bits).do_more = true;
        (conn->proto).ftpc.state = FTP_STOP;
        return CURLE_OK;
      }
      Curl_resolv_unlock(data,local_158);
      if (local_14c != 0xe5) {
        return CVar4;
      }
      if ((conn->proto).ftpc.count1 != 0) {
        return CVar4;
      }
      CVar4 = ftp_epsv_disable(conn);
      return CVar4;
    }
    pcVar5 = (conn->proxy).name;
    uVar7 = uVar7 & 0xffff;
    pcVar8 = "Can\'t resolve proxy host %s:%hu";
  }
  else {
    Curl_resolv(conn,(conn->proto).ftpc.newhost,(uint)(conn->proto).ftpc.newport,&local_158);
    uVar7 = (ulong)(conn->proto).ftpc.newport;
    if (local_158 != (Curl_dns_entry *)0x0) goto LAB_004ad273;
    pcVar5 = (conn->proto).ftpc.newhost;
    pcVar8 = "Can\'t resolve new host %s:%hu";
  }
  Curl_failf(data,pcVar8,pcVar5,uVar7);
  return CURLE_FTP_CANT_GET_HOST;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct SessionHandle *data=conn->data;
  struct Curl_dns_entry *addr=NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str=&data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i=1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr=NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr=NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    int ip[4];
    int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%d,%d,%d,%d,%d,%d",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %d.%d.%d.%d for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%d.%d.%d.%d", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    rc = Curl_resolv(conn, conn->proxy.name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu",
            conn->proxy.name, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */
  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}